

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessage_Test::TestBody
          (LiteTest_DynamicCastMessage_Test *this)

{
  bool bVar1;
  char *pcVar2;
  TestPackedTypesLite *pTVar3;
  TestAllTypesLite *pTVar4;
  AssertHelper local_5e8;
  Message local_5e0;
  void *local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_11;
  Message local_5b8;
  long local_5b0;
  int local_5a4;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_580 [8];
  shared_ptr<proto2_unittest::TestPackedTypesLite> shared_2;
  Message local_568;
  element_type *local_560;
  element_type *local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_9;
  Message local_538;
  long local_530;
  int local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_500 [8];
  shared_ptr<proto2_unittest::TestAllTypesLite> shared_1;
  Message local_4e8;
  long local_4e0;
  int local_4d4;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_7;
  shared_ptr<google::protobuf::MessageLite> shared;
  Message local_4a8;
  TestAllTypesLite *local_4a0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_6;
  MessageLite *test_type_1_pointer_const_ref;
  Message local_470;
  TestAllTypesLite *local_468;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_5;
  MessageLite *test_type_1_pointer_ref;
  Message local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_4;
  MessageLite *test_type_1_pointer_nullptr;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_3;
  Message local_3f0;
  TestAllTypesLite *local_3e8;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_2;
  MessageLite *test_type_1_pointer_const;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_1;
  Message local_398 [3];
  TestAllTypesLite *local_380;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar;
  MessageLite *test_type_1_pointer;
  CastType1 test_type_1;
  LiteTest_DynamicCastMessage_Test *this_local;
  
  test_type_1.field_0._816_8_ = this;
  proto2_unittest::TestAllTypesLite::TestAllTypesLite((TestAllTypesLite *)&test_type_1_pointer);
  local_378._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )&test_type_1_pointer;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&test_type_1_pointer;
  local_380 = DynamicCastMessage<proto2_unittest::TestAllTypesLite>
                        ((MessageLite *)&test_type_1_pointer);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_*,_proto2_unittest::TestAllTypesLite_*,_nullptr>
            ((EqHelper *)local_370,"&test_type_1",
             "DynamicCastMessage<CastType1>(test_type_1_pointer)",(TestAllTypesLite **)&local_378,
             &local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x555,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  pTVar3 = DynamicCastMessage<proto2_unittest::TestPackedTypesLite>
                     ((MessageLite *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::Compare<proto2_unittest::TestPackedTypesLite>
            ((EqHelper *)local_3b0,"nullptr","DynamicCastMessage<CastType2>(test_type_1_pointer)",
             (nullptr_t)0x0,pTVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_type_1_pointer_const,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x556,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&test_type_1_pointer_const,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_type_1_pointer_const);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_3e0._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&test_type_1_pointer;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_3e0._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  local_3e8 = DynamicCastMessage<proto2_unittest::TestAllTypesLite_const>
                        ((MessageLite *)
                         local_3e0._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_*,_const_proto2_unittest::TestAllTypesLite_*,_nullptr>
            ((EqHelper *)local_3d8,"&test_type_1",
             "DynamicCastMessage<const CastType1>(test_type_1_pointer_const)",
             (TestAllTypesLite **)&local_3e0,&local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  pTVar3 = DynamicCastMessage<proto2_unittest::TestPackedTypesLite_const>
                     ((MessageLite *)
                      gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::Compare<proto2_unittest::TestPackedTypesLite_const>
            ((EqHelper *)local_408,"nullptr",
             "DynamicCastMessage<const CastType2>(test_type_1_pointer_const)",(nullptr_t)0x0,pTVar3)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_type_1_pointer_nullptr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&test_type_1_pointer_nullptr,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_type_1_pointer_nullptr);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  pTVar4 = DynamicCastMessage<proto2_unittest::TestAllTypesLite>((MessageLite *)0x0);
  testing::internal::EqHelper::Compare<proto2_unittest::TestAllTypesLite>
            ((EqHelper *)local_430,"nullptr",
             "DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr)",(nullptr_t)0x0,pTVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_type_1_pointer_ref,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x560,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_type_1_pointer_ref,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_type_1_pointer_ref);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_460._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&test_type_1_pointer;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_460._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  local_468 = DynamicCastMessage<proto2_unittest::TestAllTypesLite>
                        ((MessageLite *)
                         local_460._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_*,_proto2_unittest::TestAllTypesLite_*,_nullptr>
            ((EqHelper *)local_458,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_ref)",
             (TestAllTypesLite **)&local_460,&local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_type_1_pointer_const_ref,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x564,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&test_type_1_pointer_const_ref,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_type_1_pointer_const_ref);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_498._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )&test_type_1_pointer;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_498._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  local_4a0 = DynamicCastMessage<proto2_unittest::TestAllTypesLite>
                        ((MessageLite *)
                         local_498._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_*,_const_proto2_unittest::TestAllTypesLite_*,_nullptr>
            ((EqHelper *)local_490,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref)",
             (TestAllTypesLite **)&local_498,&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x568,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  pTVar4 = (TestAllTypesLite *)operator_new(0x348);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(pTVar4);
  std::shared_ptr<google::protobuf::MessageLite>::shared_ptr<proto2_unittest::TestAllTypesLite,void>
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_7.message_,pTVar4);
  local_4d4 = 1;
  local_4e0 = std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::
              use_count((__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> *)
                        &gtest_ar_7.message_);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_4d0,"1","shared.use_count()",&local_4d4,&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &shared_1.
                super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &shared_1.
                super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &shared_1.
                super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  std::shared_ptr<google::protobuf::MessageLite>::shared_ptr
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_8.message_,
             (shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_7.message_);
  DynamicCastMessage<proto2_unittest::TestAllTypesLite>
            ((protobuf *)local_500,(shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_8.message_
            );
  std::shared_ptr<google::protobuf::MessageLite>::~shared_ptr
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_8.message_);
  local_524 = 2;
  local_530 = std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::
              use_count((__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> *)
                        &gtest_ar_7.message_);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_520,"2","shared.use_count()",&local_524,&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_558 = std::__shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
                          *)local_500);
  local_560 = std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> *)
                         &gtest_ar_7.message_);
  testing::internal::EqHelper::
  Compare<proto2_unittest::TestAllTypesLite_*,_google::protobuf::MessageLite_*,_nullptr>
            ((EqHelper *)local_550,"shared_1.get()","shared.get()",&local_558,&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &shared_2.
                super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x570,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &shared_2.
                super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_568);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &shared_2.
                super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  std::shared_ptr<google::protobuf::MessageLite>::shared_ptr
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_10.message_,
             (shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_7.message_);
  DynamicCastMessage<proto2_unittest::TestPackedTypesLite>
            ((protobuf *)local_580,
             (shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_10.message_);
  std::shared_ptr<google::protobuf::MessageLite>::~shared_ptr
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_10.message_);
  local_5a4 = 2;
  local_5b0 = std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::
              use_count((__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> *)
                        &gtest_ar_7.message_);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_5a0,"2","shared.use_count()",&local_5a4,&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x572,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  local_5d8 = (void *)0x0;
  testing::internal::EqHelper::
  Compare<std::shared_ptr<proto2_unittest::TestPackedTypesLite>,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_5d0,"shared_2","nullptr",
             (shared_ptr<proto2_unittest::TestPackedTypesLite> *)local_580,&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x573,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  std::shared_ptr<proto2_unittest::TestPackedTypesLite>::~shared_ptr
            ((shared_ptr<proto2_unittest::TestPackedTypesLite> *)local_580);
  std::shared_ptr<proto2_unittest::TestAllTypesLite>::~shared_ptr
            ((shared_ptr<proto2_unittest::TestAllTypesLite> *)local_500);
  std::shared_ptr<google::protobuf::MessageLite>::~shared_ptr
            ((shared_ptr<google::protobuf::MessageLite> *)&gtest_ar_7.message_);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite((TestAllTypesLite *)&test_type_1_pointer);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessage) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;
  EXPECT_EQ(&test_type_1, DynamicCastMessage<CastType1>(test_type_1_pointer));
  EXPECT_EQ(nullptr, DynamicCastMessage<CastType2>(test_type_1_pointer));

  const MessageLite* test_type_1_pointer_const = &test_type_1;
  EXPECT_EQ(&test_type_1,
            DynamicCastMessage<const CastType1>(test_type_1_pointer_const));
  EXPECT_EQ(nullptr,
            DynamicCastMessage<const CastType2>(test_type_1_pointer_const));

  MessageLite* test_type_1_pointer_nullptr = nullptr;
  EXPECT_EQ(nullptr,
            DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr));

  MessageLite& test_type_1_pointer_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_ref));

  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref));

  std::shared_ptr<MessageLite> shared(new CastType1);
  EXPECT_EQ(1, shared.use_count());
  std::shared_ptr<CastType1> shared_1 = DynamicCastMessage<CastType1>(shared);
  // Check that both shared_ptr instances are pointing to the same control
  // block by checking use_count().
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_1.get(), shared.get());
  std::shared_ptr<CastType2> shared_2 = DynamicCastMessage<CastType2>(shared);
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_2, nullptr);
}